

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_default::translate
          (method_default *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  element_type *__x;
  statement_base *psVar1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffe98;
  compiler_type *in_stack_fffffffffffffea0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_00;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffef0;
  allocator_type *in_stack_ffffffffffffff08;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_ffffffffffffff10;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_ffffffffffffff18;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_ffffffffffffff20;
  token_base *in_stack_ffffffffffffff48;
  context_t *in_stack_ffffffffffffff50;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff58;
  statement_default *in_stack_ffffffffffffff60;
  
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x56520c);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x565219);
  __x = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x565221);
  this_00 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&stack0xffffffffffffff08;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin(in_stack_fffffffffffffe98);
  std::operator+((_Self *)__x,(difference_type)in_stack_fffffffffffffea0);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end(in_stack_fffffffffffffe98);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x56527f
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  compiler_type::translate
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x5652b7);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)in_stack_fffffffffffffef0);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x5652d0
            );
  psVar1 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffea0);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)this_00);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_00);
  statement_default::statement_default
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            (in_stack_fffffffffffffef0);
  return psVar1;
}

Assistant:

statement_base *
	method_default::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		return new statement_default(body, context, raw.front().back());
	}